

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
duckdb::ClientContext::GetTableNames
          (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ClientContext *this,string *query)

{
  type lock_00;
  InvalidInputException *this_00;
  ClientContext *lock_01;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
  statements;
  undefined1 local_70 [8];
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  undefined8 uStack_50;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_40;
  
  LockContext((ClientContext *)local_70);
  lock_00 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
            ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                         *)local_70);
  lock_01 = this;
  ParseStatementsInternal
            ((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
              *)&local_40,this,lock_00,query);
  if ((long)local_40.
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_40.
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
    (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
    (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_M_h)._M_element_count = 0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>::
    operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
               *)local_70);
    local_58 = (undefined1  [8])0x0;
    uStack_50._0_1_ = (__atomic_base<bool>)0x0;
    uStack_50._1_7_ = 0;
    local_68._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68._8_8_ = (element_type *)0x0;
    local_68._0_8_ = operator_new(0x18);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_)->_vptr__Sp_counted_base =
         (_func_int **)this;
    *(vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      **)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_)->_M_use_count = &local_40
    ;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._0_8_ + 0x10))->
    _vptr__Sp_counted_base = (_func_int **)__return_storage_ptr__;
    uStack_50 = ::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_context.cpp:1255:42)>
                ::_M_invoke;
    local_58 = (undefined1  [8])
               ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_context.cpp:1255:42)>
               ::_M_manager;
    RunFunctionInTransactionInternal
              (this,(ClientContextLock *)lock_01,(function<void_()> *)(local_70 + 8),true);
    if (local_58 != (undefined1  [8])0x0) {
      (*(code *)local_58)(local_70 + 8,local_70 + 8,3);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ::~vector(&local_40);
    ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
    ~unique_ptr((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
                 *)local_70);
    return __return_storage_ptr__;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_68._0_8_ = local_70 + 0x18;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_70 + 8),"Expected a single statement","");
  InvalidInputException::InvalidInputException(this_00,(string *)(local_70 + 8));
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unordered_set<string> ClientContext::GetTableNames(const string &query) {
	auto lock = LockContext();

	auto statements = ParseStatementsInternal(*lock, query);
	if (statements.size() != 1) {
		throw InvalidInputException("Expected a single statement");
	}

	unordered_set<string> result;
	RunFunctionInTransactionInternal(*lock, [&]() {
		// bind the expressions
		auto binder = Binder::CreateBinder(*this);
		binder->SetBindingMode(BindingMode::EXTRACT_NAMES);
		binder->Bind(*statements[0]);
		result = binder->GetTableNames();
	});
	return result;
}